

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadTableMacro
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  CreateFunctionInfo *info;
  _func_int **local_18;
  
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(field_id_t)deserializer,(char *)0x64);
  info = (CreateFunctionInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&stack0xffffffffffffffe8);
  Catalog::CreateFunction(this->catalog,transaction,info);
  if (local_18 != (_func_int **)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  return;
}

Assistant:

void CheckpointReader::ReadTableMacro(CatalogTransaction transaction, Deserializer &deserializer) {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "table_macro");
	auto &macro_info = info->Cast<CreateMacroInfo>();
	catalog.CreateFunction(transaction, macro_info);
}